

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo(nk_context *ctx,char **items,int count,int selected,int item_height,nk_vec2 size)

{
  nk_vec2 nVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float local_48;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x54a5,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  if (items != (char **)0x0) {
    if (ctx->current != (nk_window *)0x0) {
      if (count != 0) {
        iVar2 = (int)(ctx->style).window.spacing.y;
        nVar1 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
        local_48 = size.x;
        fStack_44 = size.y;
        fVar4 = (float)((iVar2 + item_height) * count + ((int)nVar1.y + iVar2) * 2);
        if (fVar4 <= fStack_44) {
          fStack_44 = fVar4;
        }
        nVar1.y = fStack_44;
        nVar1.x = local_48;
        iVar2 = nk_combo_begin_label(ctx,items[selected],nVar1);
        if (iVar2 != 0) {
          nk_layout_row_dynamic(ctx,(float)item_height,1);
          uVar3 = 0;
          if (count < 1) {
            count = 0;
          }
          for (; (uint)count != uVar3; uVar3 = uVar3 + 1) {
            iVar2 = nk_contextual_item_label(ctx,items[uVar3],0x11);
            if (iVar2 != 0) {
              selected = (int)uVar3;
            }
          }
          nk_contextual_end(ctx);
        }
      }
      return selected;
    }
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x54a7,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  __assert_fail("items",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x54a6,
                "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo(struct nk_context *ctx, const char **items, int count,
    int selected, int item_height, struct nk_vec2 size)
{
    int i = 0;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(items);
    NK_ASSERT(ctx->current);
    if (!ctx || !items ||!count)
        return selected;

    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);
    if (nk_combo_begin_label(ctx, items[selected], size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            if (nk_combo_item_label(ctx, items[i], NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    }
    return selected;
}